

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,OPJ_BYTE *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *ptr;
  opj_jp2_pclr_t *poVar1;
  long lVar2;
  OPJ_BYTE *p_buffer;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  OPJ_UINT32 l_value;
  OPJ_UINT32 *local_50;
  OPJ_UINT32 *local_48;
  OPJ_UINT32 local_3c;
  size_t local_38;
  
  if (p_pclr_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_pclr_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x489,
                  "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x48b,
                    "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if ((2 < p_pclr_header_size) && ((jp2->color).jp2_pclr == (opj_jp2_pclr_t *)0x0)) {
      opj_read_bytes_LE(p_pclr_header_data,&l_value,2);
      uVar3 = l_value & 0xffff;
      if (uVar3 - 0x401 < 0xfffffc00) {
        opj_event_msg(p_manager,1,"Invalid PCLR box. Reports %d entries\n",(ulong)uVar3);
      }
      else {
        local_3c = l_value;
        opj_read_bytes_LE(p_pclr_header_data + 2,&l_value,1);
        local_38 = (size_t)(ushort)l_value;
        if (local_38 == 0) {
          opj_event_msg(p_manager,1,"Invalid PCLR box. Reports 0 palette columns\n");
        }
        else if (((l_value & 0xffff) + 3 <= p_pclr_header_size) &&
                (ptr = (OPJ_UINT32 *)opj_malloc((ulong)(uVar3 * (l_value & 0xffff) * 4)),
                sVar4 = local_38, ptr != (OPJ_UINT32 *)0x0)) {
          local_48 = (OPJ_UINT32 *)opj_malloc(local_38);
          if (local_48 != (OPJ_UINT32 *)0x0) {
            local_50 = (OPJ_UINT32 *)opj_malloc(sVar4);
            if (local_50 == (OPJ_UINT32 *)0x0) {
              opj_free(ptr);
              ptr = local_48;
            }
            else {
              poVar1 = (opj_jp2_pclr_t *)opj_malloc(0x28);
              if (poVar1 != (opj_jp2_pclr_t *)0x0) {
                poVar1->channel_sign = (OPJ_BYTE *)local_50;
                poVar1->channel_size = (OPJ_BYTE *)local_48;
                poVar1->entries = ptr;
                poVar1->nr_entries = (OPJ_UINT16)local_3c;
                poVar1->nr_channels = (byte)l_value;
                poVar1->cmap = (opj_jp2_cmap_comp_t *)0x0;
                (jp2->color).jp2_pclr = poVar1;
                for (sVar4 = 0; p_buffer = p_pclr_header_data + sVar4 + 3, local_38 != sVar4;
                    sVar4 = sVar4 + 1) {
                  opj_read_bytes_LE(p_buffer,&l_value,1);
                  *(byte *)((long)local_48 + sVar4) = ((byte)l_value & 0x7f) + 1;
                  *(byte *)((long)local_50 + sVar4) = (byte)l_value >> 7;
                }
                local_50 = (OPJ_UINT32 *)0x0;
                sVar4 = local_38;
                do {
                  if ((ushort)local_3c <= (ushort)local_50) {
                    return 1;
                  }
                  for (lVar2 = 0; (ushort)lVar2 < (ushort)sVar4; lVar2 = lVar2 + 1) {
                    uVar3 = *(byte *)((long)local_48 + lVar2) + 7 >> 3;
                    uVar5 = (ulong)uVar3;
                    if (3 < uVar3) {
                      uVar5 = 4;
                    }
                    if ((long)(ulong)p_pclr_header_size <
                        (long)(p_buffer + (uVar5 - (long)p_pclr_header_data))) {
                      return 0;
                    }
                    opj_read_bytes_LE(p_buffer,&l_value,(OPJ_UINT32)uVar5);
                    p_buffer = p_buffer + uVar5;
                    *ptr = l_value;
                    ptr = ptr + 1;
                    sVar4 = local_38;
                  }
                  local_50 = (OPJ_UINT32 *)(ulong)((int)local_50 + 1);
                } while( true );
              }
              opj_free(ptr);
              opj_free(local_48);
              ptr = local_50;
            }
          }
          opj_free(ptr);
        }
      }
    }
    return 0;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x48a,
                "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_pclr_header_data,
                                  OPJ_UINT32 p_pclr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_pclr_t *jp2_pclr;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    OPJ_UINT16 nr_entries, nr_channels;
    OPJ_UINT16 i, j;
    OPJ_UINT32 l_value;
    OPJ_BYTE *orig_header_data = p_pclr_header_data;

    /* preconditions */
    assert(p_pclr_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    (void)p_pclr_header_size;

    if (jp2->color.jp2_pclr) {
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3) {
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 2);    /* NE */
    p_pclr_header_data += 2;
    nr_entries = (OPJ_UINT16) l_value;
    if ((nr_entries == 0U) || (nr_entries > 1024U)) {
        opj_event_msg(p_manager, EVT_ERROR, "Invalid PCLR box. Reports %d entries\n",
                      (int)nr_entries);
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* NPC */
    ++p_pclr_header_data;
    nr_channels = (OPJ_UINT16) l_value;
    if (nr_channels == 0U) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid PCLR box. Reports 0 palette columns\n");
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3 + (OPJ_UINT32)nr_channels) {
        return OPJ_FALSE;
    }

    entries = (OPJ_UINT32*) opj_malloc(sizeof(OPJ_UINT32) * nr_channels *
                                       nr_entries);
    if (!entries) {
        return OPJ_FALSE;
    }
    channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_size) {
        opj_free(entries);
        return OPJ_FALSE;
    }
    channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_sign) {
        opj_free(entries);
        opj_free(channel_size);
        return OPJ_FALSE;
    }

    jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
    if (!jp2_pclr) {
        opj_free(entries);
        opj_free(channel_size);
        opj_free(channel_sign);
        return OPJ_FALSE;
    }

    jp2_pclr->channel_sign = channel_sign;
    jp2_pclr->channel_size = channel_size;
    jp2_pclr->entries = entries;
    jp2_pclr->nr_entries = nr_entries;
    jp2_pclr->nr_channels = (OPJ_BYTE) l_value;
    jp2_pclr->cmap = NULL;

    jp2->color.jp2_pclr = jp2_pclr;

    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* Bi */
        ++p_pclr_header_data;

        channel_size[i] = (OPJ_BYTE)((l_value & 0x7f) + 1);
        channel_sign[i] = (l_value & 0x80) ? 1 : 0;
    }

    for (j = 0; j < nr_entries; ++j) {
        for (i = 0; i < nr_channels; ++i) {
            OPJ_UINT32 bytes_to_read = (OPJ_UINT32)((channel_size[i] + 7) >> 3);

            if (bytes_to_read > sizeof(OPJ_UINT32)) {
                bytes_to_read = sizeof(OPJ_UINT32);
            }
            if ((ptrdiff_t)p_pclr_header_size < (ptrdiff_t)(p_pclr_header_data -
                    orig_header_data) + (ptrdiff_t)bytes_to_read) {
                return OPJ_FALSE;
            }

            opj_read_bytes(p_pclr_header_data, &l_value, bytes_to_read);    /* Cji */
            p_pclr_header_data += bytes_to_read;
            *entries = (OPJ_UINT32) l_value;
            entries++;
        }
    }

    return OPJ_TRUE;
}